

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O1

pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
* __thiscall
QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
::try_emplace<>(pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
                *__return_storage_ptr__,
               QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
               *this,int *key)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  bool bVar4;
  long lVar5;
  const_iterator cVar6;
  
  cVar6 = lower_bound(this,key);
  lVar5 = cVar6.i;
  if ((lVar5 == (this->c).keys.super_QVLABase<int>.super_QVLABaseBase.s) ||
     (*key < *(int *)((long)(this->c).keys.super_QVLABase<int>.super_QVLABaseBase.ptr + lVar5 * 4)))
  {
    QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>::emplace<>
              (&(this->c).values,
               (const_iterator)
               (lVar5 * 0x58 +
               (long)(this->c).values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
                     super_QVLABaseBase.ptr));
    QVLABase<int>::resize_impl
              ((QVLABase<int> *)this,0x14,&(this->c).keys.super_QVLAStorage<4UL,_4UL,_20LL>,
               (this->c).keys.super_QVLABase<int>.super_QVLABaseBase.s + 1,key);
    lVar2 = (this->c).keys.super_QVLABase<int>.super_QVLABaseBase.s;
    pvVar3 = (this->c).keys.super_QVLABase<int>.super_QVLABaseBase.ptr;
    pvVar1 = (void *)((long)pvVar3 + lVar5 * 4);
    std::_V2::__rotate<unsigned_char*>
              (pvVar1,(long)pvVar3 + lVar2 * 4 + -4,(void *)((long)pvVar3 + lVar2 * 4));
    lVar5 = (long)pvVar1 - (long)(this->c).keys.super_QVLABase<int>.super_QVLABaseBase.ptr >> 2;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  (__return_storage_ptr__->first).c = &this->c;
  (__return_storage_ptr__->first).i = lVar5;
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }